

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::BeginFunctionBody
          (BinaryReaderObjdumpDisassemble *this,Index index,Offset size)

{
  bool bVar1;
  size_type sVar2;
  const_pointer pcVar3;
  undefined1 local_38 [8];
  string_view name;
  Offset size_local;
  Index index_local;
  BinaryReaderObjdumpDisassemble *this_local;
  
  name.size_ = size;
  printf("%06zx func[%u]",
         ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
         state)->offset,(ulong)index);
  _local_38 = anon_unknown_16::BinaryReaderObjdumpBase::GetFunctionName
                        (&this->super_BinaryReaderObjdumpBase,index);
  bVar1 = string_view::empty((string_view *)local_38);
  if (!bVar1) {
    sVar2 = string_view::length((string_view *)local_38);
    pcVar3 = string_view::data((string_view *)local_38);
    printf(" <%.*s>",sVar2 & 0xffffffff,pcVar3);
  }
  printf(":\n");
  this->last_opcode_end = 0;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::BeginFunctionBody(Index index,
                                                         Offset size) {
  printf("%06" PRIzx " func[%" PRIindex "]", state->offset, index);
  auto name = GetFunctionName(index);
  if (!name.empty()) {
    printf(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  printf(":\n");

  last_opcode_end = 0;
  return Result::Ok;
}